

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::FunctionalTest::checkResults
          (FunctionalTest *this,GLenum primitive_type,GLuint clip_function,
          vector<float,_std::allocator<float>_> *results)

{
  size_type sVar1;
  reference pvVar2;
  double dVar3;
  int local_64;
  ulong local_58;
  int local_48;
  uint local_38;
  GLuint i_primitive_type;
  GLuint i_pixels;
  GLuint base;
  GLuint increment;
  GLfloat integral;
  vector<float,_std::allocator<float>_> *results_local;
  GLuint clip_function_local;
  GLenum primitive_type_local;
  FunctionalTest *this_local;
  
  sVar1 = std::vector<float,_std::allocator<float>_>::size(results);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    base = 0;
    if (primitive_type == 1) {
      sVar1 = std::vector<float,_std::allocator<float>_>::size(results);
      dVar3 = sqrt((double)sVar1);
      local_48 = (int)(long)dVar3 + 1;
      sVar1 = std::vector<float,_std::allocator<float>_>::size(results);
      dVar3 = sqrt((double)sVar1);
      local_58 = (long)dVar3 & 0xffffffff;
    }
    else {
      local_48 = 1;
      local_58 = std::vector<float,_std::allocator<float>_>::size(results);
    }
    for (local_38 = 0; sVar1 = std::vector<float,_std::allocator<float>_>::size(results),
        local_38 < sVar1; local_38 = local_48 + local_38) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](results,(ulong)local_38);
      base = (GLuint)(*pvVar2 + (float)base);
    }
    if (primitive_type == 0) {
      local_64 = 0;
    }
    else {
      local_64 = 2;
      if (primitive_type == 1) {
        local_64 = 1;
      }
    }
    if (ABS(m_expected_integral[local_64 * 4 + clip_function] -
            (float)base / (float)(local_58 & 0xffffffff)) <= 0.01) {
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool gl3cts::ClipDistance::FunctionalTest::checkResults(glw::GLenum primitive_type, glw::GLuint clip_function,
														std::vector<glw::GLfloat>& results)
{
	/* Check for errors */
	if (results.size() == 0)
	{
		return false;
	}

	/* Calculate surface/line integral */
	glw::GLfloat integral = 0.f;

	glw::GLuint increment = (glw::GLuint)((primitive_type == GL_LINES) ?
											  glw::GLuint(sqrt(glw::GLfloat(results.size()))) + 1 /* line integral */ :
											  1 /* surface integral */);
	glw::GLuint base = (glw::GLuint)((primitive_type == GL_LINES) ?
										 glw::GLuint(sqrt(glw::GLfloat(results.size()))) /* line integral */ :
										 results.size() /* surface integral */);

	for (glw::GLuint i_pixels = 0; i_pixels < results.size(); i_pixels += increment)
	{
		integral += results[i_pixels];
	}

	integral /= static_cast<glw::GLfloat>(base);

	/* Check with results' lookup table */
	glw::GLuint i_primitive_type = (primitive_type == GL_POINTS) ? 0 : ((primitive_type == GL_LINES) ? 1 : 2);

	if (fabs(m_expected_integral[i_primitive_type * m_clip_function_count + clip_function] - integral) >
		0.01 /* Precision */)
	{
		return false;
	}

	return true;
}